

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

size_t embree::avx::createMortonCodeArray<embree::UserGeometry>
                 (UserGeometry *mesh,mvector<BVHBuilderMorton::BuildPrim> *morton,
                 BuildProgressMonitor *progressMonitor)

{
  unsigned_long *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  runtime_error *prVar10;
  size_t sVar11;
  ulong last;
  unsigned_long last_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  task_group_context *in_stack_fffffffffffffa48;
  size_t taskCount;
  unsigned_long *local_5a8;
  unsigned_long local_5a0;
  anon_class_16_2_ed117de8_conflict10 local_598;
  UserGeometry **local_588;
  undefined1 local_580 [8];
  unsigned_long *local_578;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_570;
  undefined1 local_560 [8];
  MortonCodeMapping mapping_1;
  UserGeometry *mesh_local;
  anon_class_8_1_898bcfc2_conflict11 local_520;
  MortonCodeMapping mapping;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb_empty;
  task_group_context context;
  long alStack_230 [64];
  
  puVar1 = (unsigned_long *)morton->size_active;
  cb_empty.first = 0;
  cb_empty.second.lower.field_0.m128[0] = INFINITY;
  cb_empty.second.lower.field_0.m128[1] = INFINITY;
  cb_empty.second.lower.field_0.m128[2] = INFINITY;
  cb_empty.second.lower.field_0.m128[3] = INFINITY;
  cb_empty.second.upper.field_0.m128[0] = -INFINITY;
  cb_empty.second.upper.field_0.m128[1] = -INFINITY;
  cb_empty.second.upper.field_0.m128[2] = -INFINITY;
  cb_empty.second.upper.field_0.m128[3] = -INFINITY;
  mapping_1.base.field_0._0_8_ = &mesh_local;
  mesh_local = mesh;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  mapping.base.field_0._8_8_ = 0;
  mapping.base.field_0._0_8_ = puVar1;
  mapping.scale.field_0._0_8_ = 0x400;
  local_580 = (undefined1  [8])&local_598;
  local_578 = (unsigned_long *)&mapping_1;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>,embree::avx::createMortonCodeArray<embree::UserGeometry>(embree::UserGeometry*,embree::vector_t<embree::avx::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::avx::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::createMortonCodeArray<embree::UserGeometry>(embree::UserGeometry*,embree::vector_t<embree::avx::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::avx::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>const&,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>const&,embr___embree::BBox<embree::Vec3fa>>const__std__pair<unsigned_long,embree::BBox<embree::Vec3fa>>const___1_>
            (&cb,(d1 *)&mapping,(blocked_range<unsigned_long> *)&cb_empty,
             (pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> *)local_580,
             (anon_class_16_2_ed117de8_conflict10 *)local_580,(anon_class_1_0_00000001 *)&context,
             in_stack_fffffffffffffa48);
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar6 != '\0') {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"task cancelled");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if ((unsigned_long *)cb.first == puVar1) {
    mapping.base.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)cb.second.lower.field_0;
    auVar15 = vsubps_avx((undefined1  [16])cb.second.upper.field_0,
                         (undefined1  [16])cb.second.lower.field_0);
    auVar16._8_4_ = 0x1fec1e4a;
    auVar16._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar16._12_4_ = 0x1fec1e4a;
    auVar17 = vcmpps_avx(auVar15,auVar16,6);
    auVar19 = vrcpps_avx(auVar15);
    fVar2 = auVar19._0_4_;
    auVar12._0_4_ = auVar15._0_4_ * fVar2;
    fVar3 = auVar19._4_4_;
    auVar12._4_4_ = auVar15._4_4_ * fVar3;
    fVar4 = auVar19._8_4_;
    auVar12._8_4_ = auVar15._8_4_ * fVar4;
    fVar5 = auVar19._12_4_;
    auVar12._12_4_ = auVar15._12_4_ * fVar5;
    auVar18._8_4_ = 0x3f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar18._12_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar18,auVar12);
    auVar13._0_4_ = (fVar2 + fVar2 * auVar19._0_4_) * 1013.76;
    auVar13._4_4_ = (fVar3 + fVar3 * auVar19._4_4_) * 1013.76;
    auVar13._8_4_ = (fVar4 + fVar4 * auVar19._8_4_) * 1013.76;
    auVar13._12_4_ = (fVar5 + fVar5 * auVar19._12_4_) * 1013.76;
    mapping.scale.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vandps_avx(auVar17,auVar13);
    mapping_1.base.field_0._8_8_ = morton;
    mapping_1.base.field_0._0_8_ = &mapping;
    mapping_1.scale.field_0._0_8_ = &mesh_local;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_578 = (unsigned_long *)0x0;
    local_570._0_8_ = 0x400;
    local_598.reduction = (anon_class_1_0_00000001 *)&mapping_1;
    local_580 = (undefined1  [8])puVar1;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::avx::createMortonCodeArray<embree::UserGeometry>(embree::UserGeometry*,embree::vector_t<embree::avx::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::avx::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::range<unsigned_long>const&)_2_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::createMortonCodeArray<embree::UserGeometry>(embree::UserGeometry*,embree::vector_t<embree::avx::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::avx::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::range<unsigned_long>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)local_580,(anon_class_8_1_898bcfc2 *)&local_598,
               &context);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar6 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
  }
  else {
    mapping_1.base.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)cb.second.lower.field_0;
    auVar15 = vsubps_avx((undefined1  [16])cb.second.upper.field_0,
                         (undefined1  [16])cb.second.lower.field_0);
    auVar17._8_4_ = 0x1fec1e4a;
    auVar17._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar17._12_4_ = 0x1fec1e4a;
    auVar17 = vcmpps_avx(auVar15,auVar17,6);
    auVar19 = vrcpps_avx(auVar15);
    fVar2 = auVar19._0_4_;
    auVar14._0_4_ = auVar15._0_4_ * fVar2;
    fVar3 = auVar19._4_4_;
    auVar14._4_4_ = auVar15._4_4_ * fVar3;
    fVar4 = auVar19._8_4_;
    auVar14._8_4_ = auVar15._8_4_ * fVar4;
    fVar5 = auVar19._12_4_;
    auVar14._12_4_ = auVar15._12_4_ * fVar5;
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar19,auVar14);
    auVar15._0_4_ = (fVar2 + fVar2 * auVar19._0_4_) * 1013.76;
    auVar15._4_4_ = (fVar3 + fVar3 * auVar19._4_4_) * 1013.76;
    auVar15._8_4_ = (fVar4 + fVar4 * auVar19._8_4_) * 1013.76;
    auVar15._12_4_ = (fVar5 + fVar5 * auVar19._12_4_) * 1013.76;
    mapping_1.scale.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vandps_avx(auVar17,auVar15);
    local_598.reduction = (anon_class_1_0_00000001 *)&mapping_1;
    local_5a0 = 0;
    local_5a8 = puVar1;
    local_598.func = (anon_class_8_1_898ec2eb *)morton;
    local_588 = &mesh_local;
    iVar7 = tbb::detail::d1::max_concurrency();
    uVar8 = (long)puVar1 + 0x3ffU >> 10;
    last = (long)iVar7;
    if (uVar8 <= (ulong)(long)iVar7) {
      last = uVar8;
    }
    if (0x3f < last) {
      last = 0x40;
    }
    local_570._0_8_ = &taskCount;
    local_580 = (undefined1  [8])&local_5a0;
    local_578 = (unsigned_long *)&local_5a8;
    local_560 = (undefined1  [8])&local_598;
    taskCount = last;
    local_570._8_8_ = &context;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&mapping,(context_traits)0x4,CUSTOM_CTX);
    local_520.func = (anon_class_40_5_11684cf9_conflict2 *)local_580;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43)>
              (0,last,1,&local_520,(task_group_context *)&mapping);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&mapping);
    if (cVar6 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&mapping);
    lVar9 = 0;
    for (sVar11 = 0; taskCount != sVar11; sVar11 = sVar11 + 1) {
      alStack_230[sVar11] = lVar9;
      lVar9 = lVar9 + *(long *)(context.padding + sVar11 * 8 + -0x48);
    }
    local_598.reduction = (anon_class_1_0_00000001 *)&mapping_1;
    local_5a0 = 0;
    local_5a8 = puVar1;
    local_598.func = (anon_class_8_1_898ec2eb *)morton;
    local_588 = &mesh_local;
    iVar7 = tbb::detail::d1::max_concurrency();
    if ((ulong)(long)iVar7 < uVar8) {
      uVar8 = (long)iVar7;
    }
    last_00 = 0x40;
    if (uVar8 < 0x40) {
      last_00 = uVar8;
    }
    local_580 = (undefined1  [8])&local_5a0;
    local_578 = (unsigned_long *)&local_5a8;
    local_570._0_8_ = &taskCount;
    local_560 = (undefined1  [8])&local_598;
    taskCount = last_00;
    local_570._8_8_ = &context;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&mapping,(context_traits)0x4,CUSTOM_CTX);
    local_520.func = (anon_class_40_5_11684cf9_conflict2 *)local_580;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43)>
              (0,last_00,1,&local_520,(task_group_context *)&mapping);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&mapping);
    if (cVar6 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&mapping);
    lVar9 = 0;
    for (sVar11 = 0; taskCount != sVar11; sVar11 = sVar11 + 1) {
      alStack_230[sVar11] = lVar9;
      lVar9 = lVar9 + *(long *)(context.padding + sVar11 * 8 + -0x48);
    }
  }
  return cb.first;
}

Assistant:

size_t createMortonCodeArray(Mesh* mesh, mvector<BVHBuilderMorton::BuildPrim>& morton, BuildProgressMonitor& progressMonitor)
    {
      size_t numPrimitives = morton.size();

      /* compute scene bounds */
      std::pair<size_t,BBox3fa> cb_empty(0,empty);
      auto cb = parallel_reduce 
        ( size_t(0), numPrimitives, size_t(1024), cb_empty, [&](const range<size_t>& r) -> std::pair<size_t,BBox3fa>
          {
            size_t num = 0;
            BBox3fa bounds = empty;
            
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa prim_bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&prim_bounds))) continue;
              bounds.extend(center2(prim_bounds));
              num++;
            }
            return std::make_pair(num,bounds);
          }, [] (const std::pair<size_t,BBox3fa>& a, const std::pair<size_t,BBox3fa>& b) {
          return std::make_pair(a.first + b.first,merge(a.second,b.second)); 
        });
      
      
      size_t numPrimitivesGen = cb.first;
      const BBox3fa centBounds = cb.second;
      
      /* compute morton codes */
      if (likely(numPrimitivesGen == numPrimitives))
      {
        /* fast path if all primitives were valid */
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_for( size_t(0), numPrimitives, size_t(1024), [&](const range<size_t>& r) -> void {
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
              generator(mesh->bounds(j),unsigned(j));
          });
      }
      else
      {
        /* slow path, fallback in case some primitives were invalid */
        ParallelPrefixSumState<size_t> pstate;
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&bounds))) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());
        
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[base]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (!mesh->buildBounds(j,&bounds)) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());          
      }
      return numPrimitivesGen;
    }